

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::matchesAny
               (char *name,vector<doctest::String,_std::allocator<doctest::String>_> *filters,
               bool matchEmpty,bool caseSensitive)

{
  bool bVar1;
  int iVar2;
  reference this;
  char *wild;
  String *curr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<doctest::String,_std::allocator<doctest::String>_> *__range2;
  bool caseSensitive_local;
  bool matchEmpty_local;
  vector<doctest::String,_std::allocator<doctest::String>_> *filters_local;
  char *name_local;
  
  bVar1 = std::vector<doctest::String,_std::allocator<doctest::String>_>::empty(filters);
  if ((bVar1) && (matchEmpty)) {
    name_local._7_1_ = true;
  }
  else {
    __end2 = std::vector<doctest::String,_std::allocator<doctest::String>_>::begin(filters);
    curr = (String *)std::vector<doctest::String,_std::allocator<doctest::String>_>::end(filters);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
                                       *)&curr), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<const_doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
             ::operator*(&__end2);
      wild = String::c_str(this);
      iVar2 = wildcmp(name,wild,caseSensitive);
      if (iVar2 != 0) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
      ::operator++(&__end2);
    }
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

bool matchesAny(const char* name, const std::vector<String>& filters, bool matchEmpty,
                    bool caseSensitive) {
        if(filters.empty() && matchEmpty)
            return true;
        for(auto& curr : filters)
            if(wildcmp(name, curr.c_str(), caseSensitive))
                return true;
        return false;
    }